

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_builder.h
# Opt level: O2

NodeRef __thiscall
embree::sse2::BVHNBuilderVirtual<4>::
BVHNBuilderT<embree::sse2::CreateLeaf<4,_embree::TriangleM<4>_>_>::createLeaf
          (BVHNBuilderT<embree::sse2::CreateLeaf<4,_embree::TriangleM<4>_>_> *this,PrimRef *prims,
          range<unsigned_long> *set,Allocator *alloc)

{
  atomic<unsigned_long> *paVar1;
  undefined4 *puVar2;
  char *pcVar3;
  float fVar4;
  FastAllocator *this_00;
  ThreadLocal *pTVar5;
  ThreadLocal2 *this_01;
  Scene *pSVar6;
  Geometry *pGVar7;
  long lVar8;
  RTCFilterFunctionN p_Var9;
  undefined4 uVar10;
  undefined4 uVar11;
  undefined4 uVar12;
  undefined4 uVar13;
  undefined4 uVar14;
  undefined4 uVar15;
  undefined4 uVar16;
  undefined4 uVar17;
  undefined4 uVar18;
  undefined8 uVar19;
  ulong uVar20;
  ulong uVar21;
  char *pcVar22;
  ulong uVar23;
  size_t sVar24;
  ulong uVar25;
  long lVar26;
  float *pfVar27;
  ulong uVar28;
  long lVar29;
  vuint<4> vgeomID;
  Vec3vf<4> v0;
  Vec3vf<4> v1;
  Vec3vf<4> v2;
  vuint<4> vprimID;
  
  uVar23 = set->_begin;
  uVar20 = (set->_end - uVar23) + 3 >> 2;
  vgeomID.field_0.v[0] = uVar20 * 0xb0;
  this_00 = alloc->alloc;
  pTVar5 = alloc->talloc1;
  this_01 = pTVar5->parent;
  if (this_00 != (this_01->alloc)._M_b._M_p) {
    v1.field_0._8_1_ = 1;
    v1.field_0._0_8_ = this_01;
    MutexSys::lock(&this_01->mutex);
    if ((this_01->alloc)._M_b._M_p != (__pointer_type)0x0) {
      LOCK();
      paVar1 = &((this_01->alloc)._M_b._M_p)->bytesUsed;
      (paVar1->super___atomic_base<unsigned_long>)._M_i =
           (paVar1->super___atomic_base<unsigned_long>)._M_i +
           (this_01->alloc1).bytesUsed + (this_01->alloc0).bytesUsed;
      UNLOCK();
      LOCK();
      paVar1 = &((this_01->alloc)._M_b._M_p)->bytesFree;
      (paVar1->super___atomic_base<unsigned_long>)._M_i =
           (paVar1->super___atomic_base<unsigned_long>)._M_i +
           (((this_01->alloc0).end + (this_01->alloc1).end) -
           ((this_01->alloc0).cur + (this_01->alloc1).cur));
      UNLOCK();
      LOCK();
      paVar1 = &((this_01->alloc)._M_b._M_p)->bytesWasted;
      (paVar1->super___atomic_base<unsigned_long>)._M_i =
           (paVar1->super___atomic_base<unsigned_long>)._M_i +
           (this_01->alloc1).bytesWasted + (this_01->alloc0).bytesWasted;
      UNLOCK();
    }
    (this_01->alloc0).bytesUsed = 0;
    (this_01->alloc0).bytesWasted = 0;
    (this_01->alloc0).end = 0;
    (this_01->alloc0).allocBlockSize = 0;
    (this_01->alloc0).ptr = (char *)0x0;
    (this_01->alloc0).cur = 0;
    if (this_00 == (FastAllocator *)0x0) {
      (this_01->alloc1).bytesUsed = 0;
      (this_01->alloc1).bytesWasted = 0;
      (this_01->alloc1).end = 0;
      (this_01->alloc1).allocBlockSize = 0;
      (this_01->alloc1).ptr = (char *)0x0;
      (this_01->alloc1).cur = 0;
    }
    else {
      (this_01->alloc0).allocBlockSize = this_00->defaultBlockSize;
      (this_01->alloc1).ptr = (char *)0x0;
      (this_01->alloc1).cur = 0;
      (this_01->alloc1).end = 0;
      (this_01->alloc1).allocBlockSize = 0;
      (this_01->alloc1).bytesUsed = 0;
      (this_01->alloc1).bytesWasted = 0;
      (this_01->alloc1).allocBlockSize = this_00->defaultBlockSize;
    }
    LOCK();
    (this_01->alloc)._M_b._M_p = this_00;
    UNLOCK();
    v0.field_0._0_8_ = &FastAllocator::s_thread_local_allocators_lock;
    v0.field_0._8_1_ = 1;
    v2.field_0._0_8_ = this_01;
    MutexSys::lock((MutexSys *)&FastAllocator::s_thread_local_allocators_lock);
    std::
    vector<embree::FastAllocator::ThreadLocal2_*,_std::allocator<embree::FastAllocator::ThreadLocal2_*>_>
    ::push_back(&this_00->thread_local_allocators,(value_type *)&v2);
    Lock<embree::MutexSys>::~Lock((Lock<embree::MutexSys> *)&v0);
    Lock<embree::MutexSys>::~Lock((Lock<embree::MutexSys> *)&v1);
  }
  uVar19 = vgeomID.field_0.v[0];
  pTVar5->bytesUsed = pTVar5->bytesUsed + vgeomID.field_0.v[0];
  sVar24 = pTVar5->cur;
  uVar25 = (ulong)(-(int)sVar24 & 0xf);
  uVar21 = sVar24 + vgeomID.field_0.v[0] + uVar25;
  pTVar5->cur = uVar21;
  if (pTVar5->end < uVar21) {
    pTVar5->cur = sVar24;
    uVar21 = pTVar5->allocBlockSize;
    if ((ulong)(vgeomID.field_0.v[0] * 4) < uVar21 || vgeomID.field_0.v[0] * 4 - uVar21 == 0) {
      v0.field_0._0_8_ = uVar21;
      pcVar22 = (char *)FastAllocator::malloc(this_00,(size_t)&v0);
      pTVar5->ptr = pcVar22;
      sVar24 = (pTVar5->end - pTVar5->cur) + pTVar5->bytesWasted;
      pTVar5->bytesWasted = sVar24;
      pTVar5->end = v0.field_0._0_8_;
      pTVar5->cur = uVar19;
      if ((ulong)v0.field_0._0_8_ < (ulong)uVar19) {
        pTVar5->cur = 0;
        v0.field_0._0_8_ = pTVar5->allocBlockSize;
        pcVar22 = (char *)FastAllocator::malloc(this_00,(size_t)&v0);
        pTVar5->ptr = pcVar22;
        sVar24 = (pTVar5->end - pTVar5->cur) + pTVar5->bytesWasted;
        pTVar5->bytesWasted = sVar24;
        pTVar5->end = v0.field_0._0_8_;
        pTVar5->cur = uVar19;
        if ((ulong)v0.field_0._0_8_ < (ulong)uVar19) {
          pTVar5->cur = 0;
          pcVar22 = (char *)0x0;
          goto LAB_0046ede5;
        }
      }
      pTVar5->bytesWasted = sVar24;
    }
    else {
      pcVar22 = (char *)FastAllocator::malloc(this_00,(size_t)&vgeomID);
    }
  }
  else {
    pTVar5->bytesWasted = pTVar5->bytesWasted + uVar25;
    pcVar22 = pTVar5->ptr + (uVar21 - vgeomID.field_0._0_8_);
  }
LAB_0046ede5:
  for (uVar21 = 0; uVar21 != uVar20; uVar21 = uVar21 + 1) {
    uVar25 = set->_end;
    pSVar6 = ((this->createLeafFunc).bvh)->scene;
    vgeomID.field_0.v[0] = -1;
    vgeomID.field_0.i[2] = 0xffffffff;
    vgeomID.field_0.i[3] = 0xffffffff;
    vprimID.field_0.i[0] = 0xffffffff;
    vprimID.field_0.i[1] = 0xffffffff;
    vprimID.field_0.i[2] = 0xffffffff;
    vprimID.field_0.i[3] = 0xffffffff;
    v0.field_0._32_8_ = 0;
    v0.field_0._40_8_ = 0;
    v0.field_0._16_8_ = 0;
    v0.field_0._24_8_ = 0;
    v0.field_0._0_8_ = 0;
    v0.field_0._8_8_ = 0;
    v1.field_0._32_8_ = 0;
    v1.field_0._40_8_ = 0;
    v1.field_0._16_8_ = 0;
    v1.field_0._24_8_ = 0;
    v1.field_0._0_8_ = 0;
    v1.field_0._8_8_ = 0;
    v2.field_0._32_8_ = 0;
    v2.field_0._40_8_ = 0;
    v2.field_0._16_8_ = 0;
    v2.field_0._24_8_ = 0;
    v2.field_0._0_8_ = 0;
    v2.field_0._8_8_ = 0;
    pfVar27 = prims[uVar23].upper.field_0.m128 + 3;
    for (uVar28 = 0; (uVar28 < 4 && (uVar23 + uVar28 < uVar25)); uVar28 = uVar28 + 1) {
      fVar4 = *pfVar27;
      pGVar7 = (pSVar6->geometries).items[(uint)pfVar27[-4]].ptr;
      lVar29 = (ulong)(uint)fVar4 *
               pGVar7[1].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i;
      lVar26 = *(long *)&pGVar7->field_0x58;
      lVar8 = *(long *)&pGVar7[1].time_range.upper;
      p_Var9 = pGVar7[1].intersectionFilterN;
      puVar2 = (undefined4 *)(lVar8 + (ulong)*(uint *)(lVar26 + lVar29) * (long)p_Var9);
      uVar10 = *puVar2;
      uVar11 = puVar2[1];
      uVar12 = puVar2[2];
      puVar2 = (undefined4 *)(lVar8 + (ulong)*(uint *)(lVar26 + 4 + lVar29) * (long)p_Var9);
      uVar13 = *puVar2;
      uVar14 = puVar2[1];
      uVar15 = puVar2[2];
      puVar2 = (undefined4 *)(lVar8 + (ulong)*(uint *)(lVar26 + 8 + lVar29) * (long)p_Var9);
      uVar16 = *puVar2;
      uVar17 = puVar2[1];
      uVar18 = puVar2[2];
      vgeomID.field_0.i[uVar28] = (uint)pfVar27[-4];
      vprimID.field_0.i[uVar28] = (uint)fVar4;
      *(undefined4 *)((long)&v0.field_0 + uVar28 * 4) = uVar10;
      *(undefined4 *)((long)&v0.field_0 + uVar28 * 4 + 0x10) = uVar11;
      *(undefined4 *)((long)&v0.field_0 + uVar28 * 4 + 0x20) = uVar12;
      *(undefined4 *)((long)&v1.field_0 + uVar28 * 4) = uVar13;
      *(undefined4 *)((long)&v1.field_0 + uVar28 * 4 + 0x10) = uVar14;
      *(undefined4 *)((long)&v1.field_0 + uVar28 * 4 + 0x20) = uVar15;
      *(undefined4 *)((long)&v2.field_0 + uVar28 * 4) = uVar16;
      *(undefined4 *)((long)&v2.field_0 + uVar28 * 4 + 0x10) = uVar17;
      *(undefined4 *)((long)&v2.field_0 + uVar28 * 4 + 0x20) = uVar18;
      pfVar27 = pfVar27 + 8;
    }
    lVar26 = uVar21 * 0xb0;
    pcVar3 = pcVar22 + lVar26;
    *(undefined4 *)pcVar3 = v0.field_0._0_4_;
    *(undefined4 *)(pcVar3 + 4) = v0.field_0._4_4_;
    *(undefined4 *)(pcVar3 + 8) = v0.field_0._8_4_;
    *(undefined4 *)(pcVar3 + 0xc) = v0.field_0._12_4_;
    pcVar3 = pcVar22 + lVar26 + 0x10;
    *(undefined4 *)pcVar3 = v0.field_0._16_4_;
    *(undefined4 *)(pcVar3 + 4) = v0.field_0._20_4_;
    *(undefined4 *)(pcVar3 + 8) = v0.field_0._24_4_;
    *(undefined4 *)(pcVar3 + 0xc) = v0.field_0._28_4_;
    pcVar3 = pcVar22 + lVar26 + 0x20;
    *(undefined4 *)pcVar3 = v0.field_0._32_4_;
    *(undefined4 *)(pcVar3 + 4) = v0.field_0._36_4_;
    *(undefined4 *)(pcVar3 + 8) = v0.field_0._40_4_;
    *(undefined4 *)(pcVar3 + 0xc) = v0.field_0._44_4_;
    pfVar27 = (float *)(pcVar22 + lVar26 + 0x30);
    *pfVar27 = (float)v0.field_0._0_4_ - (float)v1.field_0._0_4_;
    pfVar27[1] = (float)v0.field_0._4_4_ - (float)v1.field_0._4_4_;
    pfVar27[2] = (float)v0.field_0._8_4_ - (float)v1.field_0._8_4_;
    pfVar27[3] = (float)v0.field_0._12_4_ - (float)v1.field_0._12_4_;
    pfVar27 = (float *)(pcVar22 + lVar26 + 0x40);
    *pfVar27 = (float)v0.field_0._16_4_ - (float)v1.field_0._16_4_;
    pfVar27[1] = (float)v0.field_0._20_4_ - (float)v1.field_0._20_4_;
    pfVar27[2] = (float)v0.field_0._24_4_ - (float)v1.field_0._24_4_;
    pfVar27[3] = (float)v0.field_0._28_4_ - (float)v1.field_0._28_4_;
    pfVar27 = (float *)(pcVar22 + lVar26 + 0x50);
    *pfVar27 = (float)v0.field_0._32_4_ - (float)v1.field_0._32_4_;
    pfVar27[1] = (float)v0.field_0._36_4_ - (float)v1.field_0._36_4_;
    pfVar27[2] = (float)v0.field_0._40_4_ - (float)v1.field_0._40_4_;
    pfVar27[3] = (float)v0.field_0._44_4_ - (float)v1.field_0._44_4_;
    pfVar27 = (float *)(pcVar22 + lVar26 + 0x60);
    *pfVar27 = (float)v2.field_0._0_4_ - (float)v0.field_0._0_4_;
    pfVar27[1] = (float)v2.field_0._4_4_ - (float)v0.field_0._4_4_;
    pfVar27[2] = (float)v2.field_0._8_4_ - (float)v0.field_0._8_4_;
    pfVar27[3] = (float)v2.field_0._12_4_ - (float)v0.field_0._12_4_;
    pfVar27 = (float *)(pcVar22 + lVar26 + 0x70);
    *pfVar27 = (float)v2.field_0._16_4_ - (float)v0.field_0._16_4_;
    pfVar27[1] = (float)v2.field_0._20_4_ - (float)v0.field_0._20_4_;
    pfVar27[2] = (float)v2.field_0._24_4_ - (float)v0.field_0._24_4_;
    pfVar27[3] = (float)v2.field_0._28_4_ - (float)v0.field_0._28_4_;
    pfVar27 = (float *)(pcVar22 + lVar26 + 0x80);
    *pfVar27 = (float)v2.field_0._32_4_ - (float)v0.field_0._32_4_;
    pfVar27[1] = (float)v2.field_0._36_4_ - (float)v0.field_0._36_4_;
    pfVar27[2] = (float)v2.field_0._40_4_ - (float)v0.field_0._40_4_;
    pfVar27[3] = (float)v2.field_0._44_4_ - (float)v0.field_0._44_4_;
    *(longlong *)(pcVar22 + lVar26 + 0x90) = vgeomID.field_0.v[0];
    *(longlong *)((long)(pcVar22 + lVar26 + 0x90) + 8) =
         CONCAT44(vgeomID.field_0.i[3],vgeomID.field_0.i[2]);
    *(ulong *)(pcVar22 + lVar26 + 0xa0) = CONCAT44(vprimID.field_0.i[1],vprimID.field_0.i[0]);
    *(ulong *)(pcVar22 + lVar26 + 0xa0 + 8) = CONCAT44(vprimID.field_0.i[3],vprimID.field_0.i[2]);
    uVar23 = uVar23 + uVar28;
  }
  uVar23 = 7;
  if (uVar20 < 7) {
    uVar23 = uVar20;
  }
  return (NodeRef)(uVar23 | (ulong)pcVar22 | 8);
}

Assistant:

NodeRef createLeaf (const PrimRef* prims, const range<size_t>& set, const Allocator& alloc) {
            return createLeafFunc(prims,set,alloc);
          }